

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testRST.cxx
# Opt level: O3

int testRST(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  bool ret;
  int iVar3;
  ostream *poVar4;
  void *this;
  int iVar5;
  bool a_eol;
  bool e_eol;
  string fname;
  string a_line;
  string a_name;
  string e_name;
  string dir;
  ifstream a_fin;
  ifstream e_fin;
  bool local_101a;
  bool local_1019;
  string local_1018;
  string local_ff8;
  long *local_fd8;
  long local_fd0;
  long local_fc8 [2];
  long *local_fb8;
  long local_fb0;
  long local_fa8 [2];
  long *local_f98;
  long local_f90;
  long local_f88 [2];
  string local_f78;
  undefined1 local_f58 [16];
  streambuf local_f48 [16];
  byte abStack_f38 [216];
  ios_base local_e60 [272];
  cmRST local_d50;
  
  if (argc != 2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Usage: testRST <dir>",0x14);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '(');
    std::ostream::put('(');
    std::ostream::flush();
    return 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f98,argv[1],(allocator<char> *)&local_d50);
  if (local_f90 == 0) {
    std::__cxx11::string::_M_replace((ulong)&local_f98,0,(char *)0x0,0x4b6d1b);
  }
  local_fd8 = local_fc8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_fd8,"testRST.actual","");
  local_fb8 = local_fa8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_fb8,local_f98,local_f90 + (long)local_f98);
  std::__cxx11::string::append((char *)&local_fb8);
  paVar1 = &local_1018.field_2;
  local_1018._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1018,local_f98,local_f90 + (long)local_f98);
  std::__cxx11::string::append((char *)&local_1018);
  std::ofstream::ofstream(local_f58,(char *)local_fd8,_S_out);
  if ((abStack_f38[(long)*(_func_int **)(local_f58._0_8_ + -0x18)] & 5) == 0) {
    local_f78._M_dataplus._M_p = (pointer)&local_f78.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f78,local_f98,local_f90 + (long)local_f98);
    cmRST::cmRST(&local_d50,(ostream *)local_f58,&local_f78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f78._M_dataplus._M_p != &local_f78.field_2) {
      operator_delete(local_f78._M_dataplus._M_p,local_f78.field_2._M_allocated_capacity + 1);
    }
    bVar2 = cmRST::ProcessFile(&local_d50,&local_1018,false);
    if (bVar2) {
      cmRST::~cmRST(&local_d50);
      local_f58._0_8_ = _VTT;
      *(undefined8 *)(local_f58 + (long)_VTT[-3]) = _vtable;
      std::filebuf::~filebuf((filebuf *)(local_f58 + 8));
      std::ios_base::~ios_base(local_e60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1018._M_dataplus._M_p != paVar1) {
        operator_delete(local_1018._M_dataplus._M_p,
                        CONCAT71(local_1018.field_2._M_allocated_capacity._1_7_,
                                 local_1018.field_2._M_local_buf[0]) + 1);
      }
      std::ifstream::ifstream(&local_d50,(char *)local_fb8,_S_in);
      std::ifstream::ifstream(local_f58,(char *)local_fd8,_S_in);
      if ((*(byte *)((long)local_d50.CMakeDirective.regmatch.startp +
                    *(long *)&local_d50.OS[-1].field_0xf8 + -0x18) & 5) == 0) {
        if ((abStack_f38[(long)*(_func_int **)(local_f58._0_8_ + -0x18)] & 5) != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Could not open input ",0x15);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,(char *)local_fd8,local_fd0);
          std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
          goto LAB_0013d512;
        }
        iVar5 = 1;
        do {
          local_1018._M_string_length = 0;
          local_1018.field_2._M_local_buf[0] = '\0';
          local_ff8._M_dataplus._M_p = (pointer)&local_ff8.field_2;
          local_ff8._M_string_length = 0;
          local_ff8.field_2._M_local_buf[0] = '\0';
          local_1018._M_dataplus._M_p = (pointer)paVar1;
          bVar2 = cmsys::SystemTools::GetLineFromStream
                            ((istream *)&local_d50,&local_1018,&local_1019,-1);
          ret = cmsys::SystemTools::GetLineFromStream
                          ((istream *)local_f58,&local_ff8,&local_101a,-1);
          if ((((bVar2 != ret) || (local_1018._M_string_length != local_ff8._M_string_length)) ||
              ((local_1018._M_string_length != 0 &&
               (iVar3 = bcmp(local_1018._M_dataplus._M_p,local_ff8._M_dataplus._M_p,
                             local_1018._M_string_length), iVar3 != 0)))) ||
             (local_1019 != local_101a)) {
            std::istream::seekg((long)local_f58,_S_beg);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Actual output does not match that expected on line ",
                       0x33);
            poVar4 = (ostream *)std::ostream::operator<<(&std::cerr,iVar5);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,".",1);
            std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
            std::ostream::put((char)poVar4);
            poVar4 = (ostream *)std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Expected ",9);
            reportLine((ostream *)&std::cerr,bVar2,&local_1018,local_1019);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," but got ",9);
            reportLine((ostream *)&std::cerr,ret,&local_ff8,local_101a);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,".",1);
            std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '(');
            std::ostream::put('(');
            poVar4 = (ostream *)std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Actual output:",0xe);
            std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
            std::ostream::put((char)poVar4);
            this = (void *)std::ostream::flush();
            std::ostream::operator<<(this,local_f48);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_ff8._M_dataplus._M_p != &local_ff8.field_2) {
              operator_delete(local_ff8._M_dataplus._M_p,
                              CONCAT71(local_ff8.field_2._M_allocated_capacity._1_7_,
                                       local_ff8.field_2._M_local_buf[0]) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1018._M_dataplus._M_p != paVar1) {
              operator_delete(local_1018._M_dataplus._M_p,
                              CONCAT71(local_1018.field_2._M_allocated_capacity._1_7_,
                                       local_1018.field_2._M_local_buf[0]) + 1);
            }
            iVar5 = 1;
            goto LAB_0013d52a;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_ff8._M_dataplus._M_p != &local_ff8.field_2) {
            operator_delete(local_ff8._M_dataplus._M_p,
                            CONCAT71(local_ff8.field_2._M_allocated_capacity._1_7_,
                                     local_ff8.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1018._M_dataplus._M_p != paVar1) {
            operator_delete(local_1018._M_dataplus._M_p,
                            CONCAT71(local_1018.field_2._M_allocated_capacity._1_7_,
                                     local_1018.field_2._M_local_buf[0]) + 1);
          }
          iVar5 = iVar5 + 1;
        } while (bVar2 && ret);
        iVar5 = 0;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Could not open input ",0x15);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(char *)local_fb8,local_fb0);
        std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
LAB_0013d512:
        std::ostream::put((char)poVar4);
        iVar5 = 1;
        std::ostream::flush();
      }
LAB_0013d52a:
      std::ifstream::~ifstream(local_f58);
      std::ifstream::~ifstream(&local_d50);
      goto LAB_0013d451;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Could not open input ",0x15);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,local_1018._M_dataplus._M_p,
                        local_1018._M_string_length);
    std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    cmRST::~cmRST(&local_d50);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Could not open output ",0x16);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(char *)local_fd8,local_fd0);
    std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
  }
  local_f58._0_8_ = _VTT;
  *(undefined8 *)(local_f58 + (long)_VTT[-3]) = _vtable;
  std::filebuf::~filebuf((filebuf *)(local_f58 + 8));
  std::ios_base::~ios_base(local_e60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1018._M_dataplus._M_p != paVar1) {
    operator_delete(local_1018._M_dataplus._M_p,
                    CONCAT71(local_1018.field_2._M_allocated_capacity._1_7_,
                             local_1018.field_2._M_local_buf[0]) + 1);
  }
  iVar5 = 1;
LAB_0013d451:
  if (local_fb8 != local_fa8) {
    operator_delete(local_fb8,local_fa8[0] + 1);
  }
  if (local_fd8 != local_fc8) {
    operator_delete(local_fd8,local_fc8[0] + 1);
  }
  if (local_f98 != local_f88) {
    operator_delete(local_f98,local_f88[0] + 1);
  }
  return iVar5;
}

Assistant:

int testRST(int argc, char* argv[])
{
  if (argc != 2) {
    std::cerr << "Usage: testRST <dir>" << std::endl;
    return 1;
  }
  std::string dir = argv[1];
  if (dir.empty()) {
    dir = ".";
  }
  std::string a_name = "testRST.actual";
  std::string e_name = dir + "/testRST.expect";

  // Process the test RST file.
  {
    std::string fname = dir + "/testRST.rst";
    std::ofstream fout(a_name.c_str());
    if (!fout) {
      std::cerr << "Could not open output " << a_name << std::endl;
      return 1;
    }

    cmRST r(fout, dir);
    if (!r.ProcessFile(fname)) {
      std::cerr << "Could not open input " << fname << std::endl;
      return 1;
    }
  }

  // Compare expected and actual outputs.
  cmsys::ifstream e_fin(e_name.c_str());
  cmsys::ifstream a_fin(a_name.c_str());
  if (!e_fin) {
    std::cerr << "Could not open input " << e_name << std::endl;
    return 1;
  }
  if (!a_fin) {
    std::cerr << "Could not open input " << a_name << std::endl;
    return 1;
  }
  int lineno = 0;
  bool e_ret;
  bool a_ret;
  do {
    std::string e_line;
    std::string a_line;
    bool e_eol;
    bool a_eol;
    e_ret = cmSystemTools::GetLineFromStream(e_fin, e_line, &e_eol);
    a_ret = cmSystemTools::GetLineFromStream(a_fin, a_line, &a_eol);
    ++lineno;
    if (e_ret != a_ret || e_line != a_line || e_eol != a_eol) {
      a_fin.seekg(0, std::ios::beg);
      std::cerr << "Actual output does not match that expected on line "
                << lineno << "." << std::endl
                << "Expected ";
      reportLine(std::cerr, e_ret, e_line, e_eol);
      std::cerr << " but got ";
      reportLine(std::cerr, a_ret, a_line, a_eol);
      std::cerr << "." << std::endl
                << "Actual output:" << std::endl
                << a_fin.rdbuf();
      return 1;
    }
  } while (e_ret && a_ret);
  return 0;
}